

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_urlencode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 local_34;
  char *pcStack_30;
  int nLen;
  char *zIn;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zIn = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
  }
  else {
    pcStack_30 = jx9_value_to_string(*apArg,(int *)&local_34);
    if ((int)local_34 < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      SyUriEncode(pcStack_30,local_34,Consumer,pjStack_18);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_urlencode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the URL encoding */
	SyUriEncode(zIn, (sxu32)nLen, Consumer, pCtx);
	return JX9_OK;
}